

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

boolean block_door(xchar x,xchar y)

{
  char rmno;
  int iVar1;
  char *pcVar2;
  monst *mtmp;
  char *pcVar3;
  
  pcVar2 = in_rooms(level,x,y,0x12);
  rmno = *pcVar2;
  if ((-1 < (long)rmno) && ('\x11' < level->rooms[rmno].rtype)) {
    if (level->locations[x][y].typ != '\x17') {
      return '\0';
    }
    if (rmno != u.ushops[0]) {
      return '\0';
    }
    mtmp = shop_keeper(level,rmno);
    if ((((((mtmp != (monst *)0x0) && (iVar1 = inhishop(mtmp), iVar1 != 0)) &&
          (mtmp->mx == (char)mtmp[0x1b].movement)) &&
         ((mtmp->my == *(char *)((long)&mtmp[0x1b].movement + 1) &&
          ((char)mtmp[0x1b].mintrinsics == x)))) &&
        ((*(char *)((long)&mtmp[0x1b].mintrinsics + 1) == y &&
         ((*(uint *)&mtmp->field_0x60 & 0xc0000) == 0x40000)))) &&
       (((*(int *)&mtmp[0x1b].field_0x60 != 0 ||
         (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) != 0)) ||
        (iVar1._0_1_ = mtmp[0x1b].mtame, iVar1._1_1_ = mtmp[0x1b].m_ap_type,
        iVar1._2_1_ = mtmp[0x1b].mfrozen, iVar1._3_1_ = mtmp[0x1b].mblinded, iVar1 != 0)))) {
      pcVar2 = " senses your motion and";
      if (u.uprops[0xd].blocked != 0) {
        pcVar2 = "";
      }
      pcVar3 = "";
      if (youmonst.data == mons + 0x7b) {
        pcVar3 = pcVar2;
      }
      if (youmonst.data == mons + 0x9e) {
        pcVar3 = pcVar2;
      }
      if (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0) {
        pcVar3 = pcVar2;
      }
      pline("%s%s blocks your way!",(undefined1 *)((long)&mtmp[0x1c].minvent + 5),pcVar3);
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean block_door(xchar x, xchar y)
{
	int roomno = *in_rooms(level, x, y, SHOPBASE);
	struct monst *shkp;

	if (roomno < 0 || !IS_SHOP(level, roomno)) return FALSE;
	if (!IS_DOOR(level->locations[x][y].typ)) return FALSE;
	if (roomno != *u.ushops) return FALSE;

	if (!(shkp = shop_keeper(level, (char)roomno)) || !inhishop(shkp))
		return FALSE;

	if (shkp->mx == ESHK(shkp)->shk.x && shkp->my == ESHK(shkp)->shk.y
	    /* Actually, the shk should be made to block _any_
	     * door, including a door the player digs, if the
	     * shk is within a 'jumping' distance.
	     */
	    && ESHK(shkp)->shd.x == x && ESHK(shkp)->shd.y == y
	    && shkp->mcanmove && !shkp->msleeping
	    && (ESHK(shkp)->debit || ESHK(shkp)->billct ||
		ESHK(shkp)->robbed)) {
		pline("%s%s blocks your way!", shkname(shkp),
				Invis ? " senses your motion and" : "");
		return TRUE;
	}
	return FALSE;
}